

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

char * __thiscall
cmOutputConverter::GetRelativeRootPath(cmOutputConverter *this,RelativeRoot relroot)

{
  cmState *pcVar1;
  char *pcVar2;
  
  switch(relroot) {
  case HOME:
    pcVar1 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pcVar2 = cmState::GetSourceDirectory(pcVar1);
    return pcVar2;
  case START:
    pcVar2 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
    return pcVar2;
  case HOME_OUTPUT:
    pcVar1 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pcVar2 = cmState::GetBinaryDirectory(pcVar1);
    return pcVar2;
  case START_OUTPUT:
    pcVar2 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
    return pcVar2;
  default:
    return (char *)0x0;
  }
}

Assistant:

const char* cmOutputConverter::GetRelativeRootPath(RelativeRoot relroot) const
{
  switch (relroot)
    {
    case HOME:         return this->GetState()->GetSourceDirectory();
    case START:        return this->StateSnapshot.GetCurrentSourceDirectory();
    case HOME_OUTPUT:  return this->GetState()->GetBinaryDirectory();
    case START_OUTPUT: return this->StateSnapshot.GetCurrentBinaryDirectory();
    default: break;
    }
  return 0;
}